

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall kj::Exception::truncateCommonTrace(Exception *this)

{
  size_t sVar1;
  void **ppvVar2;
  uint in_ECX;
  ArrayPtr<void_*> space;
  uint local_160;
  uint local_15c;
  uint j;
  uint i;
  ulong local_150;
  undefined1 local_148 [8];
  ArrayPtr<void_*const> refTrace;
  void *refTraceSpace [36];
  Exception *this_local;
  
  if (((this->isFullTrace & 1U) != 0) && (this->isFullTrace = false, this->traceCount != 0)) {
    memset(&refTrace.size_,0,0x120);
    ArrayPtr<void*>::ArrayPtr<36ul>((ArrayPtr<void*> *)&j,(void *(*) [36])&refTrace.size_);
    space.size_ = 0;
    space.ptr = (void **)local_150;
    _local_148 = kj::getStackTrace(_j,space,in_ECX);
    sVar1 = ArrayPtr<void_*const>::size((ArrayPtr<void_*const> *)local_148);
    for (local_15c = (uint)sVar1; local_15c != 0; local_15c = local_15c - 1) {
      ppvVar2 = ArrayPtr<void_*const>::operator[]
                          ((ArrayPtr<void_*const> *)local_148,(ulong)(local_15c - 1));
      if (*ppvVar2 == this->trace[this->traceCount - 1]) {
        for (local_160 = 0; local_160 < local_15c; local_160 = local_160 + 1) {
          if (this->traceCount <= local_160) {
            this->traceCount = 0;
            return;
          }
          ppvVar2 = ArrayPtr<void_*const>::operator[]
                              ((ArrayPtr<void_*const> *)local_148,
                               (ulong)((local_15c - local_160) - 1));
          if ((*ppvVar2 != this->trace[(this->traceCount - local_160) - 1]) &&
             (sVar1 = ArrayPtr<void_*const>::size((ArrayPtr<void_*const> *)local_148),
             sVar1 >> 1 < (ulong)local_160)) {
            this->traceCount = this->traceCount - local_160;
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Exception::truncateCommonTrace() {
  if (isFullTrace) {
    // We're truncating the common portion of the full trace, turning it back into a limited
    // trace.
    isFullTrace = false;
  } else {
    // If the trace was never extended in the first place, trying to truncate it is at best a waste
    // of time and at worst might remove information for no reason. So, don't.
    //
    // This comes up in particular in coroutines, when the exception originated from a co_awaited
    // promise. In that case we manually add the one relevant frame to the trace, rather than
    // call extendTrace() just to have to truncate most of it again a moment later in the
    // unhandled_exception() callback.
    return;
  }

  if (traceCount > 0) {
    // Create a "reference" stack trace that is a little bit deeper than the one in the exception.
    void* refTraceSpace[sizeof(this->trace) / sizeof(this->trace[0]) + 4]{};
    auto refTrace = kj::getStackTrace(refTraceSpace, 0);

    // We expect that the deepest frame in the exception's stack trace should be somewhere in our
    // own trace, since our own trace has a deeper limit. Search for it.
    for (uint i = refTrace.size(); i > 0; i--) {
      if (refTrace[i-1] == trace[traceCount-1]) {
        // See how many frames match.
        for (uint j = 0; j < i; j++) {
          if (j >= traceCount) {
            // We matched the whole trace, apparently?
            traceCount = 0;
            return;
          } else if (refTrace[i-j-1] != trace[traceCount-j-1]) {
            // Found mismatching entry.

            // If we matched more than half of the reference trace, guess that this is in fact
            // the prefix we're looking for.
            if (j > refTrace.size() / 2) {
              // Delete the matching suffix.
              traceCount -= j;
              return;
            }
          }
        }
      }
    }

    // No match. Ignore.
  }
}